

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

size_t __thiscall
google::protobuf::internal::MapFieldBase::SpaceUsedExcludingSelfNoLock(MapFieldBase *this)

{
  RepeatedPtrField<google::protobuf::Message> *pRVar1;
  Rep *pRVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  
  pRVar1 = this->repeated_field_;
  if (pRVar1 == (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = (long)(pRVar1->super_RepeatedPtrFieldBase).total_size_ << 3;
    pRVar2 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
    if (pRVar2 != (Rep *)0x0) {
      if (0 < pRVar2->allocated_size) {
        lVar5 = 0;
        do {
          lVar3 = (**(code **)(*pRVar2->elements[lVar5] + 0x78))();
          sVar4 = sVar4 + lVar3;
          lVar5 = lVar5 + 1;
          pRVar2 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
        } while (lVar5 < pRVar2->allocated_size);
      }
      sVar4 = sVar4 + 8;
    }
  }
  return sVar4;
}

Assistant:

size_t MapFieldBase::SpaceUsedExcludingSelfNoLock() const {
  if (repeated_field_ != nullptr) {
    return repeated_field_->SpaceUsedExcludingSelfLong();
  } else {
    return 0;
  }
}